

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

void __thiscall leveldb::DBImpl::CleanupCompaction(DBImpl *this,CompactionState *compact)

{
  long lVar1;
  TableBuilder *this_00;
  pointer pOVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (compact->builder == (TableBuilder *)0x0) {
    if (compact->outfile != (WritableFile *)0x0) {
      __assert_fail("compact->outfile == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_impl.cc"
                    ,0x312,"void leveldb::DBImpl::CleanupCompaction(CompactionState *)");
    }
  }
  else {
    TableBuilder::Abandon(compact->builder);
    this_00 = compact->builder;
    if (this_00 != (TableBuilder *)0x0) {
      TableBuilder::~TableBuilder(this_00);
    }
    operator_delete(this_00,8);
    if (compact->outfile != (WritableFile *)0x0) {
      (*compact->outfile->_vptr_WritableFile[1])();
    }
  }
  lVar4 = 0;
  for (uVar3 = 0;
      pOVar2 = (compact->outputs).
               super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(compact->outputs).
                             super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2) / 0x50);
      uVar3 = uVar3 + 1) {
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::erase(&(this->pending_outputs_)._M_t,(key_type *)((long)&pOVar2->number + lVar4));
    lVar4 = lVar4 + 0x50;
  }
  std::
  vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
  ::~vector(&compact->outputs);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(compact,0x40);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DBImpl::CleanupCompaction(CompactionState* compact) {
  mutex_.AssertHeld();
  if (compact->builder != nullptr) {
    // May happen if we get a shutdown call in the middle of compaction
    compact->builder->Abandon();
    delete compact->builder;
  } else {
    assert(compact->outfile == nullptr);
  }
  delete compact->outfile;
  for (size_t i = 0; i < compact->outputs.size(); i++) {
    const CompactionState::Output& out = compact->outputs[i];
    pending_outputs_.erase(out.number);
  }
  delete compact;
}